

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.cpp
# Opt level: O0

void __thiscall
RTree::DFT_recursive
          (RTree *this,Point q,int k,RTree_node *node,vector<d_leaf_*,_std::allocator<d_leaf_*>_> *L
          ,vector<float,_std::allocator<float>_> *ddk,float *poor)

{
  vector<float,_std::allocator<float>_> *pvVar1;
  int k_00;
  RTree *q_00;
  reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference ppRVar6;
  int local_a0;
  int i_2;
  float local_88;
  int local_84;
  undefined1 local_80 [4];
  int i_1;
  vector<RTree_node_*,_std::allocator<RTree_node_*>_> branch;
  vector<float,_std::allocator<float>_> branch_value;
  float local_40;
  int local_3c;
  vector<float,_std::allocator<float>_> *pvStack_38;
  int i;
  vector<float,_std::allocator<float>_> *ddk_local;
  vector<d_leaf_*,_std::allocator<d_leaf_*>_> *L_local;
  RTree_node *node_local;
  RTree *pRStack_18;
  int k_local;
  RTree *this_local;
  Point q_local;
  
  pvStack_38 = ddk;
  ddk_local = (vector<float,_std::allocator<float>_> *)L;
  L_local = (vector<d_leaf_*,_std::allocator<d_leaf_*>_> *)node;
  node_local._4_4_ = k;
  pRStack_18 = this;
  this_local = (RTree *)q;
  if ((node->is_leaf & 1U) == 0) {
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               &branch.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<RTree_node_*,_std::allocator<RTree_node_*>_>::vector
              ((vector<RTree_node_*,_std::allocator<RTree_node_*>_> *)local_80);
    for (local_84 = 0;
        local_84 <
        *(int *)((long)&(L_local->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                        super__Vector_impl_data._M_start + 4); local_84 = local_84 + 1) {
      pvVar5 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                         ((vector<d_internal_node,_std::allocator<d_internal_node>_> *)(L_local + 2)
                          ,(long)local_84);
      local_88 = Polygon::distance_geometric(pvVar5->region,(Point)this_local);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)
                 &branch.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_88);
      pvVar5 = std::vector<d_internal_node,_std::allocator<d_internal_node>_>::operator[]
                         ((vector<d_internal_node,_std::allocator<d_internal_node>_> *)(L_local + 2)
                          ,(long)local_84);
      std::vector<RTree_node_*,_std::allocator<RTree_node_*>_>::push_back
                ((vector<RTree_node_*,_std::allocator<RTree_node_*>_> *)local_80,&pvVar5->child);
    }
    insert_sort<RTree_node>
              (this,(vector<float,_std::allocator<float>_> *)
                    &branch.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
               (vector<RTree_node_*,_std::allocator<RTree_node_*>_> *)local_80);
    for (local_a0 = 0;
        local_a0 <
        *(int *)((long)&(L_local->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                        super__Vector_impl_data._M_start + 4); local_a0 = local_a0 + 1) {
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &branch.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_a0);
      q_00 = this_local;
      k_00 = node_local._4_4_;
      if (*pvVar4 <= *poor) {
        ppRVar6 = std::vector<RTree_node_*,_std::allocator<RTree_node_*>_>::operator[]
                            ((vector<RTree_node_*,_std::allocator<RTree_node_*>_> *)local_80,
                             (long)local_a0);
        DFT_recursive(this,(Point)q_00,k_00,*ppRVar6,
                      (vector<d_leaf_*,_std::allocator<d_leaf_*>_> *)ddk_local,pvStack_38,poor);
      }
    }
    std::vector<RTree_node_*,_std::allocator<RTree_node_*>_>::~vector
              ((vector<RTree_node_*,_std::allocator<RTree_node_*>_> *)local_80);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               &branch.super__Vector_base<RTree_node_*,_std::allocator<RTree_node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    for (local_3c = 0; pvVar1 = pvStack_38,
        local_3c <
        *(int *)((long)&(L_local->super__Vector_base<d_leaf_*,_std::allocator<d_leaf_*>_>)._M_impl.
                        super__Vector_impl_data._M_start + 4); local_3c = local_3c + 1) {
      pvVar2 = std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[]
                         ((vector<d_leaf,_std::allocator<d_leaf>_> *)(L_local + 1),(long)local_3c);
      local_40 = Polygon::distance_geometric(pvVar2->region,(Point)this_local);
      std::vector<float,_std::allocator<float>_>::push_back(pvVar1,&local_40);
      pvVar1 = ddk_local;
      branch_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           (pointer)std::vector<d_leaf,_std::allocator<d_leaf>_>::operator[]
                              ((vector<d_leaf,_std::allocator<d_leaf>_> *)(L_local + 1),
                               (long)local_3c);
      std::vector<d_leaf_*,_std::allocator<d_leaf_*>_>::push_back
                ((vector<d_leaf_*,_std::allocator<d_leaf_*>_> *)pvVar1,
                 (value_type *)
                 &branch_value.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    sVar3 = std::vector<float,_std::allocator<float>_>::size(pvStack_38);
    if ((ulong)(long)node_local._4_4_ < sVar3) {
      insert_sort<d_leaf>(this,pvStack_38,(vector<d_leaf_*,_std::allocator<d_leaf_*>_> *)ddk_local);
      std::vector<float,_std::allocator<float>_>::resize(pvStack_38,(long)node_local._4_4_);
      std::vector<d_leaf_*,_std::allocator<d_leaf_*>_>::resize
                ((vector<d_leaf_*,_std::allocator<d_leaf_*>_> *)ddk_local,(long)node_local._4_4_);
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                         (pvStack_38,(long)(node_local._4_4_ + -1));
      *poor = *pvVar4;
    }
  }
  return;
}

Assistant:

void RTree::DFT_recursive(Point q, int k, RTree_node * node, std::vector<d_leaf *> & L, std::vector<float> & ddk,float & poor){
	if(node->is_leaf){
        for(int i = 0; i < node->elements; i++){
            ddk.push_back(node->data_leafs[i].region->distance_geometric(q));
            L.push_back(&node->data_leafs[i]);
        }
        if(ddk.size()>k)
        {
	        insert_sort<d_leaf>(ddk,L);
            ddk.resize(k);
            L.resize(k);
        	poor=ddk[k-1];
        }
    }
    else{
	    std::vector<float> branch_value;
		std::vector<RTree_node *> branch;
        for(int i = 0; i < node->elements; i++){
	        branch_value.push_back(node->data_internal_node[i].region->distance_geometric(q));
            branch.push_back(node->data_internal_node[i].child);
        }
        insert_sort<RTree_node>(branch_value,branch);
		for(int i = 0; i < node->elements; i++){
  	        if(branch_value[i]<=poor){
                DFT_recursive(q,k,branch[i],L,ddk,poor);
            }
        }
      }
}